

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O2

void write_unsigned_impl<unsigned_int>
               (raw_ostream *S,uint N,size_t MinDigits,IntegerStyle Style,bool IsNegative)

{
  bool bVar1;
  byte *pbVar2;
  size_t __n;
  long lVar3;
  void *__buf;
  size_t I;
  void *pvVar4;
  ArrayRef<char> Buffer;
  char NumberBuffer [128];
  
  builtin_strncpy(NumberBuffer + 0x68,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x58,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x48,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x38,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x28,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x18,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 8,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer,"00000000",8);
  pbVar2 = (byte *)(NumberBuffer + 0x77);
  lVar3 = 0;
  do {
    *pbVar2 = (byte)((ulong)N % 10) | 0x30;
    lVar3 = lVar3 + 0x100000000;
    pbVar2 = pbVar2 + -1;
    bVar1 = 9 < N;
    N = N / 10;
  } while (bVar1);
  __buf = (void *)(lVar3 >> 0x20);
  if (IsNegative) {
    llvm::raw_ostream::operator<<(S,'-');
  }
  __n = CONCAT71((int7)((ulong)pbVar2 >> 8),Style == Number || MinDigits <= __buf);
  pvVar4 = __buf;
  NumberBuffer._124_4_ = Style;
  if (Style != Number && MinDigits > __buf) {
    for (; pvVar4 < MinDigits; pvVar4 = (void *)((long)pvVar4 + 1)) {
      llvm::raw_ostream::operator<<(S,'0');
    }
  }
  Buffer.Data = NumberBuffer + (0x78 - (long)__buf);
  if (NumberBuffer._124_4_ == 1) {
    Buffer.Length = (size_type)__buf;
    writeWithCommas(S,Buffer);
  }
  else {
    llvm::raw_ostream::write(S,(int)Buffer.Data,__buf,__n);
  }
  return;
}

Assistant:

static void write_unsigned_impl(raw_ostream &S, T N, size_t MinDigits,
                                IntegerStyle Style, bool IsNegative) {
  static_assert(std::is_unsigned<T>::value, "Value is not unsigned!");

  char NumberBuffer[128];
  std::memset(NumberBuffer, '0', sizeof(NumberBuffer));

  size_t Len = 0;
  Len = format_to_buffer(N, NumberBuffer);

  if (IsNegative)
    S << '-';

  if (Len < MinDigits && Style != IntegerStyle::Number) {
    for (size_t I = Len; I < MinDigits; ++I)
      S << '0';
  }

  if (Style == IntegerStyle::Number) {
    writeWithCommas(S, ArrayRef<char>(std::end(NumberBuffer) - Len, Len));
  } else {
    S.write(std::end(NumberBuffer) - Len, Len);
  }
}